

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

bool __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
::eraseMatch<0ul,capnp::ClientHook*&>
          (Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
           *this,ClientHook **params)

{
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> table;
  HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks> local_28 [8];
  size_t local_20;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>::
  find<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,capnp::ClientHook*&>
            (local_28,table,(ClientHook **)((long)(*(long *)(this + 8) - *(size_t *)this) >> 4));
  if (local_28[0] == (HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>)0x1)
  {
    Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
    ::eraseImpl((Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
                 *)this,local_20);
  }
  return (bool)local_28[0];
}

Assistant:

bool Table<Row, Indexes...>::eraseMatch(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    eraseImpl(pos);
    return true;
  } else {
    return false;
  }
}